

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__simple_flip_3ch(float *decode_buffer,int width_times_channels)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  
  pfVar1 = decode_buffer + width_times_channels;
  pfVar10 = decode_buffer + (long)width_times_channels + -0x18;
  for (; decode_buffer <= pfVar10; decode_buffer = decode_buffer + 0x18) {
    fVar2 = *decode_buffer;
    fVar3 = decode_buffer[3];
    fVar4 = decode_buffer[6];
    fVar5 = decode_buffer[9];
    fVar6 = decode_buffer[0xc];
    fVar7 = decode_buffer[0xf];
    fVar8 = decode_buffer[0x12];
    fVar9 = decode_buffer[0x15];
    *decode_buffer = decode_buffer[2];
    decode_buffer[1] = decode_buffer[1];
    decode_buffer[2] = fVar2;
    decode_buffer[3] = decode_buffer[3];
    decode_buffer[3] = decode_buffer[5];
    decode_buffer[4] = decode_buffer[4];
    decode_buffer[5] = fVar3;
    decode_buffer[6] = decode_buffer[6];
    decode_buffer[6] = decode_buffer[8];
    decode_buffer[7] = decode_buffer[7];
    decode_buffer[8] = fVar4;
    decode_buffer[9] = decode_buffer[9];
    decode_buffer[9] = decode_buffer[0xb];
    decode_buffer[10] = decode_buffer[10];
    decode_buffer[0xb] = fVar5;
    decode_buffer[0xc] = decode_buffer[0xc];
    decode_buffer[0xc] = decode_buffer[0xe];
    decode_buffer[0xd] = decode_buffer[0xd];
    decode_buffer[0xe] = fVar6;
    decode_buffer[0xf] = decode_buffer[0xf];
    decode_buffer[0xf] = decode_buffer[0x11];
    decode_buffer[0x10] = decode_buffer[0x10];
    decode_buffer[0x11] = fVar7;
    decode_buffer[0x12] = decode_buffer[0x12];
    decode_buffer[0x12] = decode_buffer[0x14];
    decode_buffer[0x13] = decode_buffer[0x13];
    decode_buffer[0x14] = fVar8;
    decode_buffer[0x15] = fVar9;
    decode_buffer[0x15] = decode_buffer[0x17];
    decode_buffer[0x17] = fVar9;
  }
  for (; decode_buffer < pfVar1; decode_buffer = decode_buffer + 3) {
    fVar2 = *decode_buffer;
    *decode_buffer = decode_buffer[2];
    decode_buffer[2] = fVar2;
  }
  return;
}

Assistant:

static void stbir__simple_flip_3ch( float * decode_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) decode = decode_buffer;
  float const * end_decode = decode_buffer + width_times_channels;

#ifdef STBIR_SIMD
    #ifdef stbir__simdf_swiz2 // do we have two argument swizzles?
      end_decode -= 12; 
      STBIR_NO_UNROLL_LOOP_START
      while( decode <= end_decode )
      {
        // on arm64 8 instructions, no overlapping stores
        stbir__simdf a,b,c,na,nb;
        STBIR_SIMD_NO_UNROLL(decode);
        stbir__simdf_load( a, decode );
        stbir__simdf_load( b, decode+4 );
        stbir__simdf_load( c, decode+8 );

        na = stbir__simdf_swiz2( a, b, 2, 1, 0, 5 );   
        b  = stbir__simdf_swiz2( a, b, 4, 3, 6, 7 );   
        nb = stbir__simdf_swiz2( b, c, 0, 1, 4, 3 );   
        c  = stbir__simdf_swiz2( b, c, 2, 7, 6, 5 );   

        stbir__simdf_store( decode, na );
        stbir__simdf_store( decode+4, nb ); 
        stbir__simdf_store( decode+8, c );
        decode += 12;
      }
      end_decode += 12;
    #else
      end_decode -= 24;
      STBIR_NO_UNROLL_LOOP_START
      while( decode <= end_decode )
      {
        // 26 instructions on x64
        stbir__simdf a,b,c,d,e,f,g;
        float i21, i23;
        STBIR_SIMD_NO_UNROLL(decode);
        stbir__simdf_load( a, decode );
        stbir__simdf_load( b, decode+3 );
        stbir__simdf_load( c, decode+6 );
        stbir__simdf_load( d, decode+9 );
        stbir__simdf_load( e, decode+12 );
        stbir__simdf_load( f, decode+15 );
        stbir__simdf_load( g, decode+18 );

        a = stbir__simdf_swiz( a, 2, 1, 0, 3 );   
        b = stbir__simdf_swiz( b, 2, 1, 0, 3 );   
        c = stbir__simdf_swiz( c, 2, 1, 0, 3 );   
        d = stbir__simdf_swiz( d, 2, 1, 0, 3 );   
        e = stbir__simdf_swiz( e, 2, 1, 0, 3 );   
        f = stbir__simdf_swiz( f, 2, 1, 0, 3 );   
        g = stbir__simdf_swiz( g, 2, 1, 0, 3 );   

        // stores overlap, need to be in order, 
        stbir__simdf_store( decode,    a );
        i21 = decode[21];
        stbir__simdf_store( decode+3,  b ); 
        i23 = decode[23];
        stbir__simdf_store( decode+6,  c );
        stbir__simdf_store( decode+9,  d );
        stbir__simdf_store( decode+12, e );
        stbir__simdf_store( decode+15, f );
        stbir__simdf_store( decode+18, g );
        decode[21] = i23;
        decode[23] = i21;
        decode += 24;
      }
      end_decode += 24;
    #endif
#else
  end_decode -= 12;
  STBIR_NO_UNROLL_LOOP_START
  while( decode <= end_decode )
  {
    // 16 instructions
    float t0,t1,t2,t3;
    STBIR_NO_UNROLL(decode);
    t0 = decode[0]; t1 = decode[3]; t2 = decode[6]; t3 = decode[9];
    decode[0] = decode[2]; decode[3] = decode[5]; decode[6] = decode[8]; decode[9] = decode[11];
    decode[2] = t0; decode[5] = t1; decode[8] = t2; decode[11] = t3;
    decode += 12;
  }
  end_decode += 12;
#endif

  STBIR_NO_UNROLL_LOOP_START
  while( decode < end_decode )
  {
    float t = decode[0];
    STBIR_NO_UNROLL(decode);
    decode[0] = decode[2];
    decode[2] = t;
    decode += 3;
  }
}